

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O3

void maybe_tutorial(void)

{
  ushort uVar1;
  monst *pmVar2;
  level *plVar3;
  schar sVar4;
  boolean bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  obj *poVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  uint local_44;
  uint local_40;
  
  if (flags.tutorial == '\0') {
    return;
  }
  if (pl_tutorial[0] < '\x01') {
    pcVar12 = pl_tutorial;
    tutorial_latest_message = 0xc9;
    goto LAB_002707df;
  }
  if (3 < moves) {
    iVar13 = -1;
    iVar8 = -1;
    do {
      iVar15 = -1;
      do {
        plVar3 = level;
        if (((u.ux + iVar13) - 1U < 0x4f) && (uVar11 = u.uy + iVar15, uVar11 < 0x15)) {
          uVar14 = u.ux + iVar13;
          bVar5 = check_tutorial_location(uVar14,uVar11,'\0');
          if (bVar5 != '\0') {
            return;
          }
          if ((((plVar3->locations[uVar14][uVar11].field_0x6 & 8) != 0) && (flags.tutorial != '\0'))
             && (pl_tutorial[0xc] < '\x01')) {
            tutorial_latest_message = 0xd5;
            pcVar12 = pl_tutorial + 0xc;
            goto LAB_002707df;
          }
          iVar7 = dbuf_get_mon(uVar14,uVar11);
          if (iVar7 != 0) {
            iVar7 = dbuf_get_mon(uVar14,uVar11);
            if (((iVar8 == iVar7 + -1) && (flags.tutorial != '\0')) && (pl_tutorial[0x44] < '\x01'))
            {
              tutorial_latest_message = 0x10d;
              pcVar12 = pl_tutorial + 0x44;
              goto LAB_002707df;
            }
            iVar8 = dbuf_get_mon(uVar14,uVar11);
            iVar8 = iVar8 + -1;
          }
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 != 2);
      iVar13 = iVar13 + 1;
    } while (iVar13 != 2);
  }
  iVar13 = tutorial_last_combat;
  tutorial_last_combat = tutorial_last_combat + 1;
  iVar8 = tutorial_last_combat;
  for (pmVar2 = level->monlist; pmVar2 != (monst *)0x0; pmVar2 = pmVar2->nmon) {
    if (((0 < pmVar2->mhp) && ((viz_array[pmVar2->my][pmVar2->mx] & 2U) != 0)) &&
       (pmVar2->mtame == '\0')) {
      tutorial_last_combat = 0;
      iVar8 = 0;
    }
  }
  if (4 < iVar13 && iVar8 == 0) {
    if (((('\x02' < u.uz.dlevel) && (flags.elbereth_enabled != '\0')) && (flags.tutorial != '\0'))
       && (pl_tutorial[0x5c] < '\x01')) {
      pcVar12 = pl_tutorial + 0x5c;
      tutorial_latest_message = 0x125;
      goto LAB_002707df;
    }
    lVar10 = 0;
    pcVar12 = pl_tutorial + 0x59;
    do {
      if (spl_book[lVar10].sp_id == 0x187) {
        if (pl_tutorial[0x59] < '\x01' && flags.tutorial != '\0') {
          tutorial_latest_message = 0x122;
          goto LAB_002707df;
        }
      }
      else if (spl_book[lVar10].sp_id == 0) break;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x2b);
    if ((flags.tutorial != '\0') && (pl_tutorial[0x5d] < '\x01')) {
      pcVar12 = pl_tutorial + 0x5d;
      tutorial_latest_message = 0x126;
      goto LAB_002707df;
    }
  }
  if (((spl_book[1].sp_id != 0) &&
      (((((uarm != (obj *)0x0 &&
          ((ushort)((*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f) - 0xb) < 7)) ||
         ((uarms != (obj *)0x0 && (urole.malenum != 0x161)))) ||
        ((((uarmh != (obj *)0x0 && ((long)uarmh->otyp != 0x51)) &&
          (0xfff8 < (ushort)((*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f) - 0x12))) ||
         ((uarmg != (obj *)0x0 &&
          ((ushort)((*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f) - 0xb) < 7)))))) ||
       ((uarmf != (obj *)0x0 &&
        (0xfff8 < (ushort)((*(ushort *)&objects[uarmf->otyp].field_0x11 >> 4 & 0x1f) - 0x12)))))))
     && ((flags.tutorial != '\0' && (pl_tutorial[0x8b] < '\x01')))) {
    pcVar12 = pl_tutorial + 0x8b;
    tutorial_latest_message = 0x154;
    goto LAB_002707df;
  }
  if ((((uwep != &zeroobj && uwep != (obj *)0x0) && (iVar8 = weapon_dam_bonus(uwep), iVar8 < 0)) &&
      (u.twoweap == '\0')) && ((flags.tutorial != '\0' && (pl_tutorial[0x8c] < '\x01')))) {
    pcVar12 = pl_tutorial + 0x8c;
    tutorial_latest_message = 0x155;
    goto LAB_002707df;
  }
  sVar4 = tutorial_old_attribs.a[0];
  if ((1 < u.ulevel) && (flags.tutorial != '\0')) {
    if (pl_tutorial[0x77] < '\x01') {
      pcVar12 = pl_tutorial + 0x77;
      tutorial_latest_message = 0x140;
      goto LAB_002707df;
    }
    if (((u.ulevel != 2) && (flags.tutorial != '\0')) && (pl_tutorial[0x78] < '\x01')) {
      pcVar12 = pl_tutorial + 0x78;
      tutorial_latest_message = 0x141;
      goto LAB_002707df;
    }
  }
  lVar10 = 0;
  iVar8 = 0;
  do {
    cVar6 = u.acurr.a[lVar10];
    if (tutorial_old_attribs.a[lVar10] < cVar6) {
      iVar8 = 1;
    }
    if (cVar6 < tutorial_old_attribs.a[lVar10]) {
      iVar8 = -1;
    }
    tutorial_old_attribs.a[lVar10] = cVar6;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  if (sVar4 != '\0') {
    if (iVar8 < 1) {
      if (((iVar8 != 0) && (flags.tutorial != '\0')) && (pl_tutorial[0x7a] < '\x01')) {
        pcVar12 = pl_tutorial + 0x7a;
        tutorial_latest_message = 0x143;
        goto LAB_002707df;
      }
    }
    else if ((flags.tutorial != '\0') && (pl_tutorial[0x79] < '\x01')) {
      pcVar12 = pl_tutorial + 0x79;
      tutorial_latest_message = 0x142;
      goto LAB_002707df;
    }
  }
  iVar8 = (int)u.uac;
  if ((((iVar8 < tutorial_old_ac) && (tutorial_old_ac != 300)) && (flags.tutorial != '\0')) &&
     (pl_tutorial[0x7f] < '\x01')) {
    pcVar12 = pl_tutorial + 0x7f;
    tutorial_latest_message = 0x148;
    goto LAB_002707df;
  }
  tutorial_old_ac = iVar8;
  if (u.uprops[0x1d].intrinsic == 0 && u.uprops[0x1c].intrinsic == 0) {
    if (u.uprops[0x1e].intrinsic != 0) {
LAB_002705aa:
      if (ublindf != (obj *)0x0) {
LAB_002705b3:
        if (ublindf->oartifact == '\x1d') goto LAB_0027063f;
      }
      goto LAB_002706a7;
    }
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002705b3;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002705aa;
LAB_0027063f:
    if (((((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) ||
         ((youmonst.data)->mlet == '\x1c')) ||
        (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))))) ||
       (u.uprops[0x3a].intrinsic != 0)) goto LAB_002706a7;
  }
  else {
LAB_002706a7:
    if ((flags.tutorial != '\0') && (pl_tutorial[0x83] < '\x01')) {
      pcVar12 = pl_tutorial + 0x83;
      tutorial_latest_message = 0x14c;
      goto LAB_002707df;
    }
  }
  if (('\x01' < u.uz.dlevel) && (flags.tutorial != '\0')) {
    if (pl_tutorial[0x7b] < '\x01') {
      pcVar12 = pl_tutorial + 0x7b;
      tutorial_latest_message = 0x144;
      goto LAB_002707df;
    }
    if (((9 < (byte)u.uz.dlevel) && (flags.tutorial != '\0')) && (pl_tutorial[0x4a] < '\x01')) {
      pcVar12 = pl_tutorial + 0x4a;
      tutorial_latest_message = 0x113;
      goto LAB_002707df;
    }
  }
  if (((u.uhp < u.uhpmax) && (flags.tutorial != '\0')) && (pl_tutorial[0x7c] < '\x01')) {
    pcVar12 = pl_tutorial + 0x7c;
    tutorial_latest_message = 0x145;
    goto LAB_002707df;
  }
  if (((u.uen < u.uenmax) && (flags.tutorial != '\0')) && (pl_tutorial[0x7d] < '\x01')) {
    pcVar12 = pl_tutorial + 0x7d;
    tutorial_latest_message = 0x146;
    goto LAB_002707df;
  }
  if ((((u.uen < 5) && (10 < u.uenmax)) && (flags.tutorial != '\0')) && (pl_tutorial[0x7e] < '\x01')
     ) {
    pcVar12 = pl_tutorial + 0x7e;
    tutorial_latest_message = 0x147;
    goto LAB_002707df;
  }
  if (((u.umonster != u.umonnum) && (flags.tutorial != '\0')) && (pl_tutorial[0x85] < '\x01')) {
    pcVar12 = pl_tutorial + 0x85;
    tutorial_latest_message = 0x14e;
    goto LAB_002707df;
  }
  if (((0 < u.uexp) && (flags.tutorial != '\0')) && (pl_tutorial[0x80] < '\x01')) {
    pcVar12 = pl_tutorial + 0x80;
    tutorial_latest_message = 0x149;
    goto LAB_002707df;
  }
  if (u.uhs < 2) {
    if (((u.uhs == 0) && (flags.tutorial != '\0')) && (pl_tutorial[0x82] < '\x01')) {
      pcVar12 = pl_tutorial + 0x82;
      tutorial_latest_message = 0x14b;
      goto LAB_002707df;
    }
  }
  else if ((flags.tutorial != '\0') && (pl_tutorial[0x81] < '\x01')) {
    pcVar12 = pl_tutorial + 0x81;
    tutorial_latest_message = 0x14a;
    goto LAB_002707df;
  }
  bVar5 = can_advance_something();
  if (((bVar5 != '\0') && (flags.tutorial != '\0')) && (pl_tutorial[0x84] < '\x01')) {
    pcVar12 = pl_tutorial + 0x84;
    tutorial_latest_message = 0x14d;
    goto LAB_002707df;
  }
  if ((((u._1052_1_ & 1) != 0) && (flags.tutorial != '\0')) && (pl_tutorial[0x8d] < '\x01')) {
    pcVar12 = pl_tutorial + 0x8d;
    tutorial_latest_message = 0x156;
    goto LAB_002707df;
  }
  iVar8 = near_capacity();
  if (((0 < iVar8) && (flags.tutorial != '\0')) && (pl_tutorial[0x88] < '\x01')) {
    pcVar12 = pl_tutorial + 0x88;
    tutorial_latest_message = 0x151;
    goto LAB_002707df;
  }
  iVar8 = in_trouble();
  if (((0 < iVar8) && (bVar5 = can_pray('\0'), bVar5 != '\0')) &&
     ((level->locations[u.ux][u.uy].typ != '!' &&
      ((flags.tutorial != '\0' && (pl_tutorial[0x87] < '\x01')))))) {
    pcVar12 = pl_tutorial + 0x87;
    tutorial_latest_message = 0x150;
    goto LAB_002707df;
  }
  cVar6 = inside_shop(level,u.ux,u.uy);
  if (((cVar6 != '\0') && (flags.tutorial != '\0')) && (pl_tutorial[0x9f] < '\x01')) {
    pcVar12 = pl_tutorial + 0x9f;
    tutorial_latest_message = 0x168;
    goto LAB_002707df;
  }
  if (((u.uz.dnum == dungeon_topology.d_mines_dnum) && (flags.tutorial != '\0')) &&
     (pl_tutorial[0xa1] < '\x01')) {
    pcVar12 = pl_tutorial + 0xa1;
    tutorial_latest_message = 0x16a;
    goto LAB_002707df;
  }
  if (((u.uz.dnum == dungeon_topology.d_sokoban_dnum) && (flags.tutorial != '\0')) &&
     (pl_tutorial[0xa2] < '\x01')) {
    pcVar12 = pl_tutorial + 0xa2;
    tutorial_latest_message = 0x16b;
    goto LAB_002707df;
  }
  if (((check_tutorial_command_message == 0x112) && (flags.tutorial != '\0')) &&
     (pl_tutorial[0x49] < '\x01')) {
    pcVar12 = pl_tutorial + 0x49;
    tutorial_latest_message = 0x112;
    goto LAB_002707df;
  }
  if (invent != (obj *)0x0) {
    bVar16 = flags.tutorial != '\0';
    local_44 = 0;
    local_40 = 0;
    poVar9 = invent;
LAB_00270a89:
    if ((((~*(uint *)&poVar9->field_0x4a & 0x41) == 0) && (flags.tutorial != '\0')) &&
       (pl_tutorial[0x89] < '\x01')) {
      tutorial_latest_message = 0x152;
      pcVar12 = pl_tutorial + 0x89;
      goto LAB_002707df;
    }
    if (((poVar9->oartifact != '\0') && (flags.tutorial != '\0')) && (pl_tutorial[0x75] < '\x01')) {
      tutorial_latest_message = 0x13e;
      pcVar12 = pl_tutorial + 0x75;
      goto LAB_002707df;
    }
    if ((((*(uint *)&poVar9->field_0x4a & 4) != 0) && (flags.tutorial != '\0')) &&
       (pl_tutorial[0xa0] < '\x01')) {
      tutorial_latest_message = 0x169;
      pcVar12 = pl_tutorial + 0xa0;
      goto LAB_002707df;
    }
    uVar1 = poVar9->otyp;
    uVar11 = (uint)uVar1;
    if ((objects[(short)uVar1].field_0x10 & 1) == 0) {
      switch(objects[(short)uVar1].oc_class) {
      case '\x04':
      case '\x05':
        goto switchD_00270b02_caseD_4;
      default:
        break;
      case '\b':
        if ((uVar11 != 0x14f) && (uVar11 != 0x17c)) goto switchD_00270b02_caseD_a;
        goto LAB_00270b7a;
      case '\t':
        goto switchD_00270b02_caseD_9;
      case '\n':
      case '\v':
switchD_00270b02_caseD_a:
        if ((uVar11 & 0xfffffffe) == 0x1bc || ('\0' < pl_tutorial[0x76] || !bVar16)) break;
        goto LAB_00270d90;
      }
    }
switchD_00270b02_caseD_6:
    uVar14 = uVar11 - 0xda;
    if (((uVar14 < 7) &&
        (((0x6bU >> (uVar14 & 0x1f) & 1) != 0 ||
         (((uVar14 == 4 && (urole.malenum != 0x159)) && (urole.malenum != 0x164)))))) &&
       (pl_tutorial[0x6c] < '\x01' && bVar16)) {
      tutorial_latest_message = 0x135;
      pcVar12 = pl_tutorial + 0x6c;
      goto LAB_002707df;
    }
LAB_00270b7a:
    if (tutorial_last_combat == 0 && 4 < iVar13) {
      if (uVar11 == 0x41 || uVar1 < 0x41) {
        if (uVar11 < 0x15) {
          if ((0x1ebf80U >> (uVar11 & 0x1f) & 1) == 0) {
            if ((0x3eU >> (uVar11 & 0x1f) & 1) == 0) {
              if (uVar11 == 6) {
                local_40 = local_40 | 2;
              }
            }
            else {
              local_40 = local_40 | 1;
            }
          }
          else if (((poVar9 != uwep) && (flags.tutorial != '\0')) && (pl_tutorial[0x5a] < '\x01')) {
            tutorial_latest_message = 0x123;
            pcVar12 = pl_tutorial + 0x5a;
            goto LAB_002707df;
          }
        }
      }
      else if (uVar1 < 0x46) {
        local_44 = local_44 | 1;
      }
      else if (uVar11 - 0x212 < 2) {
        local_40 = local_40 | 4;
      }
      else if (uVar11 == 0x46) {
        local_44 = local_44 | 4;
      }
      else if (uVar11 == 0x47) {
        local_44 = local_44 | 2;
      }
    }
    poVar9 = poVar9->nobj;
    if (poVar9 == (obj *)0x0) goto code_r0x00270c3f;
    goto LAB_00270a89;
  }
LAB_00270c67:
  poVar9 = level->objects[u.ux][u.uy];
  if (poVar9 != (obj *)0x0) {
    pcVar12 = pl_tutorial + 0x6c;
    do {
      uVar11 = (ushort)poVar9->otyp - 0xda;
      if (((uVar11 < 4) && (uVar11 != 2)) && (pl_tutorial[0x6c] < '\x01' && flags.tutorial != '\0'))
      {
        tutorial_latest_message = 0x135;
        goto LAB_002707df;
      }
      poVar9 = (poVar9->v).v_nexthere;
    } while (poVar9 != (obj *)0x0);
  }
  if ((5 < tutorial_last_combat) &&
     (((check_tutorial_command_message < 1 ||
       (bVar5 = check_tutorial_message(check_tutorial_command_message), bVar5 == '\0')) &&
      (9 < moves)))) {
    if (flags.tutorial != '\0') {
      if (pl_tutorial[0x4f] < '\x01') {
        pcVar12 = pl_tutorial + 0x4f;
        tutorial_latest_message = 0x118;
        goto LAB_002707df;
      }
      if (((0x1d < moves) && (flags.tutorial != '\0')) && (pl_tutorial[0x50] < '\x01')) {
        pcVar12 = pl_tutorial + 0x50;
        tutorial_latest_message = 0x119;
        goto LAB_002707df;
      }
      if (moves < 0x3c) {
        return;
      }
      if (pl_tutorial[0x51] < '\x01') {
        pcVar12 = pl_tutorial + 0x51;
        tutorial_latest_message = 0x11a;
        goto LAB_002707df;
      }
    }
    if (99 < moves) {
      if ((flags.tutorial == '\0') || ('\0' < pl_tutorial[0x52])) {
        if (moves < 0x96) {
          return;
        }
        if (flags.tutorial == '\0') {
          return;
        }
        if ('\0' < pl_tutorial[0x53]) {
          return;
        }
        pcVar12 = pl_tutorial + 0x53;
        tutorial_latest_message = 0x11c;
      }
      else {
        pcVar12 = pl_tutorial + 0x52;
        tutorial_latest_message = 0x11b;
      }
LAB_002707df:
      *pcVar12 = '\x01';
      com_pager(tutorial_latest_message);
      return;
    }
  }
  return;
switchD_00270b02_caseD_9:
  if ((uVar1 - 0x1bc < 2) || (uVar11 == 0x17c)) goto LAB_00270b7a;
switchD_00270b02_caseD_4:
  if (pl_tutorial[0x76] < '\x01' && bVar16) {
LAB_00270d90:
    tutorial_latest_message = 0x13f;
    pcVar12 = pl_tutorial + 0x76;
    goto LAB_002707df;
  }
  goto switchD_00270b02_caseD_6;
code_r0x00270c3f:
  if ((((local_44 & local_40) != 0) && (flags.tutorial != '\0')) && (pl_tutorial[0x5b] < '\x01')) {
    pcVar12 = pl_tutorial + 0x5b;
    tutorial_latest_message = 0x124;
    goto LAB_002707df;
  }
  goto LAB_00270c67;
}

Assistant:

void maybe_tutorial(void)
{
	int old_tutorial_last_combat;
	int i;
	const struct monst *mtmp;

	if (!flags.tutorial) return; /* short-circuit */

	/* Check to see if any tutorial triggers have occured.
	   Stop checking once one message is output. */

	/* Welcome message: show immediately */
	if (check_tutorial_message(QT_T_WELCOME)) return;

	/* Check surroundings; these only occur if at least 3 turns
	   have elapsed, to avoid overwhelming the player early on. */
	if (moves > 3) {
	    int dx, dy;
	    int monnum = -1;
	    for (dx = -1; dx <= 1; dx++) {
		for (dy = -1; dy <= 1; dy++) {
		    if (isok(u.ux + dx, u.uy + dy)) {
			int lx = u.ux + dx;
			int ly = u.uy + dy;
			const struct rm *l = &level->locations[lx][ly];

			/* Terrain checks */
			if (check_tutorial_location(lx, ly, FALSE)) return;

			/* Adjacent invisible monsters */
			if (l->mem_invis)
			    if (check_tutorial_message(QT_T_LOOK_INVISIBLE)) return;

			/* More than one of the same monster adjacent */
			if (dbuf_get_mon(lx, ly)) {
			    if (monnum == (dbuf_get_mon(lx, ly) - 1))
				if (check_tutorial_message(QT_T_CALLMONSTER)) return;
			    monnum = dbuf_get_mon(lx, ly) - 1;
			}
		    }
		}
	    }
	}

	/* Check to see if we're in combat. */
	tutorial_last_combat++;
	old_tutorial_last_combat = tutorial_last_combat;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
	    if (!DEADMONSTER(mtmp) && cansee(mtmp->mx, mtmp->my) && !mtmp->mtame)
		tutorial_last_combat = 0;

	/* Ambient messages that only come up during combat, and only one
	   message per combat */
	if (!tutorial_last_combat && old_tutorial_last_combat > 5) {
	    if (u.uz.dlevel >= 3)
		if (flags.elbereth_enabled &&
		    check_tutorial_message(QT_T_ELBERETH)) return;
	    for (i = 0; i < MAXSPELL && spellid(i) != NO_SPELL; i++) {
		if (spellid(i) == SPE_FORCE_BOLT)
		    if (check_tutorial_message(QT_T_SPELLS)) return;
	    }
	    if (check_tutorial_message(QT_T_MELEE)) return;
	}

	/* Events! */

	if (spellid(1)) {
	    if ((uarm && is_metallic(uarm)) ||
		(uarms && !Role_if(PM_PRIEST)) || /* priests start with shields */
		(uarmh && is_metallic(uarmh) && uarmh->otyp != HELM_OF_BRILLIANCE) ||
		(uarmg && is_metallic(uarmg)) ||
		(uarmf && is_metallic(uarmf)))
		if (check_tutorial_message(QT_T_CASTER_ARMOR)) return;
	}

	if (uwep && uwep != &zeroobj && weapon_dam_bonus(uwep) < 0 && !u.twoweap)
	    if (check_tutorial_message(QT_T_WEAPON_SKILL)) return;
	if (u.ulevel >= 2)
	    if (check_tutorial_message(QT_T_LEVELUP)) return;
	if (u.ulevel >= 3)
	    if (check_tutorial_message(QT_T_RANKUP)) return;
	{
	    int incdec = 0;
	    boolean firstturn = tutorial_old_attribs.a[0] == 0;
	    for (i = 0; i < A_MAX; i++) {
		if (u.acurr.a[i] > tutorial_old_attribs.a[i]) incdec = 1;
		if (u.acurr.a[i] < tutorial_old_attribs.a[i]) incdec = -1;
		tutorial_old_attribs.a[i] = u.acurr.a[i];
	    }
	    if (!firstturn) {
		if (incdec > 0)
		    if (check_tutorial_message(QT_T_ABILUP)) return;
		if (incdec < 0)
		    if (check_tutorial_message(QT_T_ABILDOWN)) return;
	    }
	}
	if (u.uac < tutorial_old_ac && tutorial_old_ac != TUTORIAL_IMPOSSIBLE_AC)
	    if (check_tutorial_message(QT_T_ACIMPROVED)) return;
	tutorial_old_ac = u.uac;

	if (Confusion || Sick || Blind || Stunned || Hallucination || Slimed)
	    if (check_tutorial_message(QT_T_STATUS)) return;

	if (u.uz.dlevel >= 2)
	    if (check_tutorial_message(QT_T_DLEVELCHANGE)) return;
	if (u.uz.dlevel >= 10)
	    if (check_tutorial_message(QT_T_DGN_OVERVIEW)) return;

	if (u.uhp < u.uhpmax)
	    if (check_tutorial_message(QT_T_DAMAGED)) return;
	if (u.uen < u.uenmax)
	    if (check_tutorial_message(QT_T_PWUSED)) return;
	if (u.uen < 5 && u.uenmax > 10)
	    if (check_tutorial_message(QT_T_PWEMPTY)) return;

	if (u.umonster != u.umonnum)
	    if (check_tutorial_message(QT_T_POLYSELF)) return;

	if (u.uexp > 0)
	    if (check_tutorial_message(QT_T_GAINEDEXP)) return;

	if (u.uhs >= HUNGRY)
	    if (check_tutorial_message(QT_T_HUNGER)) return;
	if (u.uhs <= SATIATED)
	    if (check_tutorial_message(QT_T_SATIATION)) return;

	if (can_advance_something())
	    if (check_tutorial_message(QT_T_ENHANCE)) return;

	if (u.uswallow)
	    if (check_tutorial_message(QT_T_ENGULFED)) return;

	if (near_capacity() > UNENCUMBERED)
	    if (check_tutorial_message(QT_T_BURDEN)) return;

	if (in_trouble() > 0 && can_pray(0) &&
	    !IS_ALTAR(level->locations[u.ux][u.uy].typ))
	    if (check_tutorial_message(QT_T_MAJORTROUBLE)) return;

	if (inside_shop(level, u.ux, u.uy))
	    if (check_tutorial_message(QT_T_SHOPENTRY)) return;

	if (u.uz.dnum == mines_dnum)
	    if (check_tutorial_message(QT_T_MINES)) return;
	if (u.uz.dnum == sokoban_dnum)
	    if (check_tutorial_message(QT_T_SOKOBAN)) return;
	if (check_tutorial_command_message == QT_T_FIRE)
	    if (check_tutorial_message(QT_T_FIRE)) return;

	/* Item-dependent events. */

	{
	    int projectile_groups = 0;
	    int launcher_groups = 0;
	    struct obj *otmp;

	    for (otmp = invent; otmp; otmp = otmp->nobj) {
		if (otmp->bknown && otmp->cursed)
		    if (check_tutorial_message(QT_T_EQUIPCURSE)) return;

		if (otmp->oartifact)
		    if (check_tutorial_message(QT_T_ARTIFACT)) return;

		if (otmp->unpaid)
		    if (check_tutorial_message(QT_T_SHOPBUY)) return;

		if (!objects[otmp->otyp].oc_name_known) {
		    switch (objects[otmp->otyp].oc_class) {
		    case POTION_CLASS:
			if (otmp->otyp == POT_WATER) break;
			/* fall through */
		    case SCROLL_CLASS:
			if (otmp->otyp == SCR_BLANK_PAPER) break;
			/* fall through */
		    case WAND_CLASS:
		    case SPBOOK_CLASS:
			if (otmp->otyp == SPE_BLANK_PAPER) break;
			if (otmp->otyp == SPE_BOOK_OF_THE_DEAD) break;
			/* fall through */
		    case RING_CLASS:
		    case AMULET_CLASS:
			if (check_tutorial_message(QT_T_RANDAPPEARANCE)) return;
			break;
		    default:
			break;
		    }
		}

		/* Containers; minor spoiler here, in that it doesn't trigger
		   off a bag of tricks and a savvy player might notice that, but
		   that's not a freebie I'm worried about. */
		switch (otmp->otyp) {
		case SACK:
		    /* starting inventory for arcs/rogues, and we don't want to
		       give the message until a second container's listed */
		    if (Role_if(PM_ARCHEOLOGIST)) break;
		    if (Role_if(PM_ROGUE)) break;
		    /* otherwise fall through */
		case LARGE_BOX:
		case CHEST:
		case ICE_BOX:
		case OILSKIN_SACK:
		case BAG_OF_HOLDING:
		    if (check_tutorial_message(QT_T_ITEM_CONTAINER)) return;
		    break;
		default:
		    break;
		}

		/* Requiring a specific item during combat... */
		if (!tutorial_last_combat && old_tutorial_last_combat > 5) {
		    switch (otmp->otyp) {
		    /* Projectiles. */
		    case ARROW:
		    case ELVEN_ARROW:
		    case ORCISH_ARROW:
		    case SILVER_ARROW:
		    case YA:
			projectile_groups |= 0x1;
			break;
		    case CROSSBOW_BOLT:
			projectile_groups |= 0x2;
			break;
		    case FLINT:
		    case ROCK:
			projectile_groups |= 0x4;
			break;

		    /* Launchers. */
		    case BOW:
		    case ELVEN_BOW:
		    case ORCISH_BOW:
		    case YUMI:
			launcher_groups |= 0x1;
			break;
		    case CROSSBOW:
			launcher_groups |= 0x2;
			break;
		    case SLING:
			launcher_groups |= 0x4;
			break;

		    /* Thrown weapons. Don't count our wielded weapon in this. */
		    case DART:
		    case SHURIKEN:
		    case BOOMERANG:
		    case SPEAR:
		    case ELVEN_SPEAR:
		    case ORCISH_SPEAR:
		    case DWARVISH_SPEAR:
		    case JAVELIN:
		    case DAGGER:
		    case ELVEN_DAGGER:
		    case ORCISH_DAGGER:
		    case SILVER_DAGGER:
			if (otmp == uwep) break;
			if (check_tutorial_message(QT_T_THROWNWEAPONS)) return;
			break;

		    default:
			break;
		    }
		}
	    }
	    if (projectile_groups & launcher_groups)
		if (check_tutorial_message(QT_T_PROJECTILES)) return;
	}

	/* Items on the current square. */
	{
	    struct obj *otmp;
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		switch (otmp->otyp) {
		case LARGE_BOX:
		case CHEST:
		case ICE_BOX:
		    if (check_tutorial_message(QT_T_ITEM_CONTAINER)) return;
		    break;
		default:
		    break;
		}
	    }
	}

	/* Ambient messages that only come up outside combat */
	if (tutorial_last_combat > 5) {
	    if (check_tutorial_command_message > 0)
		if (check_tutorial_message(check_tutorial_command_message)) return;
	    if (moves >= 10)
		if (check_tutorial_message(QT_T_VIEWTUTORIAL)) return;
	    if (moves >= 30)
		if (check_tutorial_message(QT_T_CHECK_ITEMS)) return;
	    if (moves >= 60)
		if (check_tutorial_message(QT_T_OBJECTIVE)) return;
	    if (moves >= 100)
		if (check_tutorial_message(QT_T_SAVELOAD)) return;
	    if (moves >= 150)
		if (check_tutorial_message(QT_T_MESSAGERECALL)) return;
	}
}